

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  char *pcVar7;
  ImGuiViewportP **ppIVar8;
  ImGuiPopupData *pIVar9;
  ImGuiSettingsHandler *pIVar10;
  ImGuiWindow **ppIVar11;
  ImGuiTable *pIVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  char *pcVar18;
  ImRect r_5;
  float thickness;
  ImU32 col;
  ImRect r_4;
  int column_n_1;
  ImDrawList *draw_list_1;
  ImGuiTable *table_2;
  int table_n_1;
  float font_size;
  char buf_1 [32];
  ImRect r_3;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_4;
  int n_3;
  int active_id_using_key_input_count;
  ImGuiTableSettings *settings_1;
  ImGuiWindowSettings *settings;
  int n_2;
  ImFontAtlas *atlas;
  ImGuiTable *table_1;
  int n_1;
  ImGuiTabBar *tab_bar;
  int n;
  ImGuiWindow *window;
  int i_2;
  int i_1;
  int draw_list_i;
  int layer_i;
  ImGuiViewportP *viewport;
  int viewport_i_1;
  int viewport_i;
  int drawlist_count;
  int i;
  ImVector<ImGuiWindow_*> *temp_buffer;
  ImRect r_2;
  ImRect r_1;
  int column_n;
  int rect_n_1;
  char buf [128];
  ImGuiTable *table;
  int table_n;
  ImRect r;
  int rect_n;
  char *trt_rects_names [13];
  char *wrt_rects_names [8];
  ImGuiMetricsConfig *cfg;
  ImGuiIO *io;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffac8;
  float in_stack_fffffffffffffad0;
  float in_stack_fffffffffffffad4;
  float in_stack_fffffffffffffad8;
  ImU32 in_stack_fffffffffffffadc;
  ImGuiHoveredFlags in_stack_fffffffffffffae0;
  float in_stack_fffffffffffffae4;
  ImVec2 *in_stack_fffffffffffffae8;
  ImVec2 *this;
  ImGuiWindow *in_stack_fffffffffffffaf0;
  ImGuiInputSource source;
  ImDrawList *this_00;
  ImVec2 *in_stack_fffffffffffffaf8;
  ImGuiWindow *in_stack_fffffffffffffb00;
  char *local_4f8;
  ImFontAtlas *in_stack_fffffffffffffb10;
  ImGuiTableSettings *in_stack_fffffffffffffb20;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *in_stack_fffffffffffffb50;
  long in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  char *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  char *local_478;
  undefined4 in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  ImVec2 *in_stack_fffffffffffffbb0;
  ImVec2 *in_stack_fffffffffffffbb8;
  ImVec2 *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  float in_stack_fffffffffffffc0c;
  bool *in_stack_fffffffffffffc40;
  ImDrawList *in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  int local_314;
  int local_300;
  ImVec2 local_2fc;
  ImVec2 local_2f4;
  float local_2ec;
  char local_2e8 [32];
  ImRect local_2c8;
  ImDrawList *local_2b8;
  ImGuiWindow *local_2b0;
  int local_2a4;
  int local_2a0;
  uint local_29c;
  ImVec2 local_298;
  ImGuiTableSettings *local_290;
  ImGuiWindowSettings *local_288;
  int local_27c;
  ImFontAtlas *local_278;
  ImGuiTable *local_270;
  int local_264;
  ImGuiTabBar *local_260;
  int local_254;
  ImGuiWindow *local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  ImGuiViewportP *local_238;
  int local_230;
  int local_22c;
  uint local_228;
  int local_224;
  ImVector<ImGuiWindow_*> *in_stack_fffffffffffffde0;
  ImVec2 in_stack_fffffffffffffde8;
  ImVec2 in_stack_fffffffffffffdf0;
  ImVec2 local_200;
  ImVec2 local_1f8;
  ImVec2 local_1f0;
  ImRect local_1e8;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  ImVec2 local_1c0;
  ImVec2 local_1b8;
  ImRect local_1b0;
  uint local_1a0;
  int local_19c;
  undefined1 local_198 [108];
  ImGuiWindowFlags in_stack_fffffffffffffed4;
  bool *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 in_stack_ffffffffffffff00;
  int local_f0;
  ImRect local_ec;
  int local_dc;
  undefined8 local_d8 [14];
  undefined8 local_68 [9];
  ImGuiMetricsConfig *local_20;
  ImGuiIO *local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  local_18 = &GImGui->IO;
  local_20 = &GImGui->DebugMetricsConfig;
  if ((local_20->ShowStackTool & 1U) != 0) {
    ShowStackToolWindow(in_stack_fffffffffffffc40);
  }
  bVar2 = Begin(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
  if ((bVar2) && (pIVar6 = GetCurrentWindow(), pIVar6->BeginCount < 2)) {
    pcVar7 = GetVersion();
    Text("Dear ImGui %s",pcVar7);
    Text((char *)(double)(1000.0 / local_18->Framerate),(double)local_18->Framerate,
         "Application average %.3f ms/frame (%.1f FPS)");
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)local_18->MetricsRenderVertices,
         (ulong)(uint)local_18->MetricsRenderIndices,
         (long)local_18->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d visible windows, %d active allocations",(ulong)(uint)local_18->MetricsRenderWindows,
         (ulong)(uint)local_18->MetricsActiveAllocations);
    Separator();
    memcpy(local_68,&PTR_anon_var_dwarf_20d66_00219210,0x40);
    memcpy(local_d8,&PTR_anon_var_dwarf_20d66_00219250,0x68);
    if (local_20->ShowWindowsRectsType < 0) {
      local_20->ShowWindowsRectsType = 4;
    }
    if (local_20->ShowTablesRectsType < 0) {
      local_20->ShowTablesRectsType = 2;
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffac8);
    if (bVar2) {
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      MetricsHelpMarker((char *)0x13738d);
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      fVar14 = GetFontSize();
      SetNextItemWidth(fVar14 * 12.0);
      bVar2 = Combo((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                    (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    (char **)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                    (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(int)in_stack_fffffffffffffac8);
      local_20->ShowWindowsRects = (local_20->ShowWindowsRects & 1U) != 0 || bVar2;
      if (((local_20->ShowWindowsRects & 1U) != 0) && (local_10->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",local_10->NavWindow->Name);
        Indent(in_stack_fffffffffffffae4);
        for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
          local_ec = ShowMetricsWindow::Funcs::GetWindowRect
                               (in_stack_fffffffffffffb00,
                                (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
          pcVar7 = (char *)(double)local_ec.Min.x;
          dVar15 = (double)local_ec.Min.y;
          dVar16 = (double)local_ec.Max.x;
          dVar17 = (double)local_ec.Max.y;
          fVar14 = ImRect::GetWidth(&local_ec);
          fVar13 = ImRect::GetHeight(&local_ec);
          Text(pcVar7,dVar15,dVar16,dVar17,(double)fVar14,(double)fVar13,
               "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",local_68[local_dc]);
        }
        Unindent(in_stack_fffffffffffffae4);
      }
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      fVar14 = GetFontSize();
      SetNextItemWidth(fVar14 * 12.0);
      bVar2 = Combo((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                    (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    (char **)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                    (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(int)in_stack_fffffffffffffac8);
      local_20->ShowTablesRects = (local_20->ShowTablesRects & 1U) != 0 || bVar2;
      if (((local_20->ShowTablesRects & 1U) != 0) && (local_10->NavWindow != (ImGuiWindow *)0x0)) {
        local_f0 = 0;
        while (in_stack_fffffffffffffc94 = local_f0,
              iVar3 = ImPool<ImGuiTable>::GetMapSize(&local_10->Tables),
              in_stack_fffffffffffffc94 < iVar3) {
          pIVar12 = ImPool<ImGuiTable>::TryGetMapData
                              ((ImPool<ImGuiTable> *)
                               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                               (ImPoolIdx)in_stack_fffffffffffffad4);
          if (((pIVar12 != (ImGuiTable *)0x0) &&
              (local_10->FrameCount + -1 <= pIVar12->LastFrameActive)) &&
             ((pIVar12->OuterWindow == local_10->NavWindow ||
              (pIVar12->InnerWindow == local_10->NavWindow)))) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar12->ID,
                       (ulong)(uint)pIVar12->ColumnsCount,pIVar12->OuterWindow->Name);
            bVar2 = IsItemHovered(in_stack_fffffffffffffae0);
            if (bVar2) {
              in_stack_fffffffffffffc88 = GetForegroundDrawList();
              ImVec2::ImVec2(&local_108,1.0,1.0);
              in_stack_ffffffffffffff00 = operator-(in_stack_fffffffffffffac8,(ImVec2 *)0x1377df);
              ImVec2::ImVec2(&local_118,1.0,1.0);
              local_110 = operator+(in_stack_fffffffffffffac8,(ImVec2 *)0x137834);
              ImDrawList::AddRect((ImDrawList *)
                                  CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                  (ImVec2 *)in_stack_fffffffffffffb68,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                  (ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                  (float)in_stack_fffffffffffffb58,
                                  (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                  SUB84(in_stack_fffffffffffffb50,0));
            }
            Indent(in_stack_fffffffffffffae4);
            for (local_19c = 0; local_19c < 0xd; local_19c = local_19c + 1) {
              if (local_19c < 6) {
                local_1e8 = ShowMetricsWindow::Funcs::GetTableRect
                                      ((ImGuiTable *)in_stack_fffffffffffffb00,
                                       (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
                                       (int)in_stack_fffffffffffffaf8);
                pcVar7 = (char *)(double)local_1e8.Min.x;
                dVar15 = (double)local_1e8.Min.y;
                pcVar18 = (char *)(double)local_1e8.Max.x;
                dVar16 = (double)local_1e8.Max.y;
                fVar14 = ImRect::GetWidth(&local_1e8);
                fVar13 = ImRect::GetHeight(&local_1e8);
                ImFormatString(pcVar7,(size_t)dVar15,pcVar18,dVar16,(double)fVar14,(double)fVar13,
                               local_198,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               local_d8[local_19c]);
                ImVec2::ImVec2(&local_1f0,0.0,0.0);
                Selectable((char *)in_stack_fffffffffffffbb8,
                           SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),
                           (ImGuiSelectableFlags)in_stack_fffffffffffffbb0,
                           (ImVec2 *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
                bVar2 = IsItemHovered(in_stack_fffffffffffffae0);
                if (bVar2) {
                  GetForegroundDrawList();
                  in_stack_fffffffffffffbac = 1.0;
                  ImVec2::ImVec2(&local_200,1.0,1.0);
                  local_1f8 = operator-(in_stack_fffffffffffffac8,(ImVec2 *)0x137ce6);
                  in_stack_fffffffffffffbb0 = &local_1e8.Max;
                  in_stack_fffffffffffffbb8 = (ImVec2 *)&stack0xfffffffffffffdf0;
                  ImVec2::ImVec2(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbac,
                                 in_stack_fffffffffffffbac);
                  operator+(in_stack_fffffffffffffac8,(ImVec2 *)0x137d35);
                  ImDrawList::AddRect((ImDrawList *)
                                      CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                      (ImVec2 *)in_stack_fffffffffffffb68,
                                      (ImVec2 *)
                                      CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                      (ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                      (float)in_stack_fffffffffffffb58,
                                      (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                      SUB84(in_stack_fffffffffffffb50,0));
                }
              }
              else if ((local_19c == 6) || (local_19c == 8)) {
                for (local_1a0 = 0; (int)local_1a0 < pIVar12->ColumnsCount;
                    local_1a0 = local_1a0 + 1) {
                  local_1b0 = ShowMetricsWindow::Funcs::GetTableRect
                                        ((ImGuiTable *)in_stack_fffffffffffffb00,
                                         (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
                                         (int)in_stack_fffffffffffffaf8);
                  pcVar7 = (char *)(double)local_1b0.Min.x;
                  dVar15 = (double)local_1b0.Min.y;
                  pcVar18 = (char *)(double)local_1b0.Max.x;
                  dVar16 = (double)local_1b0.Max.y;
                  fVar14 = ImRect::GetWidth(&local_1b0);
                  fVar13 = ImRect::GetHeight(&local_1b0);
                  ImFormatString(pcVar7,(size_t)dVar15,pcVar18,dVar16,(double)fVar14,(double)fVar13,
                                 local_198,0x80,
                                 "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                 (ulong)local_1a0,local_d8[local_19c]);
                  ImVec2::ImVec2(&local_1b8,0.0,0.0);
                  Selectable((char *)in_stack_fffffffffffffbb8,
                             SUB81((ulong)in_stack_fffffffffffffbb0 >> 0x38,0),
                             (ImGuiSelectableFlags)in_stack_fffffffffffffbb0,
                             (ImVec2 *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                            );
                  bVar2 = IsItemHovered(in_stack_fffffffffffffae0);
                  if (bVar2) {
                    GetForegroundDrawList();
                    in_stack_fffffffffffffc00 = &local_1c8;
                    in_stack_fffffffffffffc0c = 1.0;
                    ImVec2::ImVec2(in_stack_fffffffffffffc00,1.0,1.0);
                    local_1c0 = operator-(in_stack_fffffffffffffac8,(ImVec2 *)0x137a91);
                    ImVec2::ImVec2(&local_1d8,in_stack_fffffffffffffc0c,in_stack_fffffffffffffc0c);
                    local_1d0 = operator+(in_stack_fffffffffffffac8,(ImVec2 *)0x137ae0);
                    ImDrawList::AddRect((ImDrawList *)
                                        CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70
                                                ),(ImVec2 *)in_stack_fffffffffffffb68,
                                        (ImVec2 *)
                                        CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60
                                                ),(ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                        (float)in_stack_fffffffffffffb58,
                                        (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                        SUB84(in_stack_fffffffffffffb50,0));
                  }
                }
              }
            }
            Unindent(in_stack_fffffffffffffae4);
          }
          local_f0 = local_f0 + 1;
        }
      }
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffde8,0.0,0.0);
      bVar2 = Button((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                     in_stack_fffffffffffffac8);
      if (bVar2) {
        DebugStartItemPicker();
      }
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      MetricsHelpMarker((char *)0x137df6);
      TreePop();
    }
    bVar2 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(local_10->Windows).Size);
    if (bVar2) {
      DebugNodeWindowsList
                ((ImVector<ImGuiWindow_*> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 (char *)in_stack_fffffffffffffac8);
      DebugNodeWindowsList
                ((ImVector<ImGuiWindow_*> *)
                 CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                 (char *)in_stack_fffffffffffffac8);
      bVar2 = TreeNode((char *)in_stack_fffffffffffffac8);
      if (bVar2) {
        in_stack_fffffffffffffde0 = &local_10->WindowsTempSortBuffer;
        ImVector<ImGuiWindow_*>::resize
                  ((ImVector<ImGuiWindow_*> *)
                   CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                   (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        for (local_224 = 0; local_224 < (local_10->Windows).Size; local_224 = local_224 + 1) {
          ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_224);
          if (local_10->FrameCount <= (*ppIVar11)->LastFrameActive + 1) {
            ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_224);
            ImVector<ImGuiWindow_*>::push_back
                      ((ImVector<ImGuiWindow_*> *)
                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                       (ImGuiWindow **)in_stack_fffffffffffffac8);
          }
        }
        ImQsort((void *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                (_func_int_void_ptr_void_ptr *)in_stack_fffffffffffffac8);
        DebugNodeWindowsListByBeginStackParent
                  ((ImGuiWindow **)in_stack_fffffffffffffb00,
                   (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),in_stack_fffffffffffffaf0);
        TreePop();
      }
      TreePop();
    }
    local_228 = 0;
    for (local_22c = 0; local_22c < (local_10->Viewports).Size; local_22c = local_22c + 1) {
      ppIVar8 = ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_22c);
      iVar3 = ImDrawDataBuilder::GetDrawListCount(&(*ppIVar8)->DrawDataBuilder);
      local_228 = iVar3 + local_228;
    }
    bVar2 = TreeNode("DrawLists","DrawLists (%d)",(ulong)local_228);
    if (bVar2) {
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      Checkbox((char *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
               (bool *)in_stack_fffffffffffffc00);
      for (local_230 = 0; local_230 < (local_10->Viewports).Size; local_230 = local_230 + 1) {
        ppIVar8 = ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_230);
        local_238 = *ppIVar8;
        for (local_23c = 0; local_23c < 2; local_23c = local_23c + 1) {
          for (local_240 = 0; local_240 < (local_238->DrawDataBuilder).Layers[local_23c].Size;
              local_240 = local_240 + 1) {
            ImVector<ImDrawList_*>::operator[]
                      ((local_238->DrawDataBuilder).Layers + local_23c,local_240);
            DebugNodeDrawList((ImGuiWindow *)in_stack_fffffffffffffdf0,
                              (ImDrawList *)in_stack_fffffffffffffde8,
                              (char *)in_stack_fffffffffffffde0);
          }
        }
      }
      TreePop();
    }
    bVar2 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(local_10->Viewports).Size);
    if (bVar2) {
      GetTreeNodeToLabelSpacing();
      Indent(in_stack_fffffffffffffae4);
      RenderViewportsThumbnails();
      GetTreeNodeToLabelSpacing();
      Unindent(in_stack_fffffffffffffae4);
      for (local_244 = 0; local_244 < (local_10->Viewports).Size; local_244 = local_244 + 1) {
        ImVector<ImGuiViewportP_*>::operator[](&local_10->Viewports,local_244);
        DebugNodeViewport((ImGuiViewportP *)
                          CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
      }
      TreePop();
    }
    bVar2 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(local_10->OpenPopupStack).Size);
    if (bVar2) {
      for (local_248 = 0; local_248 < (local_10->OpenPopupStack).Size; local_248 = local_248 + 1) {
        pIVar9 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_248);
        local_250 = pIVar9->Window;
        pIVar9 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_248);
        if (local_250 == (ImGuiWindow *)0x0) {
          local_478 = "NULL";
        }
        else {
          local_478 = local_250->Name;
        }
        bVar2 = false;
        if (local_250 != (ImGuiWindow *)0x0) {
          bVar2 = (local_250->Flags & 0x1000000U) != 0;
        }
        in_stack_fffffffffffffb68 = "";
        if (bVar2) {
          in_stack_fffffffffffffb68 = " ChildWindow";
        }
        in_stack_fffffffffffffb77 = false;
        if (local_250 != (ImGuiWindow *)0x0) {
          in_stack_fffffffffffffb77 = (local_250->Flags & 0x10000000U) != 0;
        }
        pcVar7 = "";
        if ((bool)in_stack_fffffffffffffb77 != false) {
          pcVar7 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar9->PopupId,local_478,
                   in_stack_fffffffffffffb68,pcVar7);
      }
      TreePop();
    }
    uVar4 = ImPool<ImGuiTabBar>::GetAliveCount(&local_10->TabBars);
    bVar2 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar4);
    if (bVar2) {
      local_254 = 0;
      while (in_stack_fffffffffffffb64 = local_254,
            iVar3 = ImPool<ImGuiTabBar>::GetMapSize(&local_10->TabBars),
            in_stack_fffffffffffffb64 < iVar3) {
        local_260 = ImPool<ImGuiTabBar>::TryGetMapData
                              ((ImPool<ImGuiTabBar> *)
                               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                               (ImPoolIdx)in_stack_fffffffffffffad4);
        if (local_260 != (ImGuiTabBar *)0x0) {
          PushID((void *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          DebugNodeTabBar((ImGuiTabBar *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (char *)in_stack_fffffffffffffc88);
          PopID();
        }
        local_254 = local_254 + 1;
      }
      TreePop();
    }
    uVar4 = ImPool<ImGuiTable>::GetAliveCount(&local_10->Tables);
    bVar2 = TreeNode("Tables","Tables (%d)",(ulong)uVar4);
    if (bVar2) {
      local_264 = 0;
      while (in_stack_fffffffffffffb60 = local_264,
            iVar3 = ImPool<ImGuiTable>::GetMapSize(&local_10->Tables),
            in_stack_fffffffffffffb60 < iVar3) {
        local_270 = ImPool<ImGuiTable>::TryGetMapData
                              ((ImPool<ImGuiTable> *)
                               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                               (ImPoolIdx)in_stack_fffffffffffffad4);
        if (local_270 != (ImGuiTable *)0x0) {
          DebugNodeTable((ImGuiTable *)in_stack_ffffffffffffff00);
        }
        local_264 = local_264 + 1;
      }
      TreePop();
    }
    local_278 = (local_10->IO).Fonts;
    bVar2 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(local_278->Fonts).Size);
    if (bVar2) {
      ShowFontAtlas(in_stack_fffffffffffffb10);
      TreePop();
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffac8);
    if (bVar2) {
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (bVar2) {
        ClearIniSettings();
      }
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (bVar2) {
        SaveIniSettingsToMemory
                  ((size_t *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      }
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      bVar2 = SmallButton((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      if (bVar2) {
        SaveIniSettingsToDisk((char *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0))
        ;
      }
      SameLine(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0);
      if ((local_10->IO).IniFilename == (char *)0x0) {
        TextUnformatted((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                        (char *)in_stack_fffffffffffffac8);
      }
      else {
        Text("\"%s\"",(local_10->IO).IniFilename);
      }
      Text((char *)(double)local_10->SettingsDirtyTimer,"SettingsDirtyTimer %.2f");
      bVar2 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(local_10->SettingsHandlers).Size);
      if (bVar2) {
        for (local_27c = 0; local_27c < (local_10->SettingsHandlers).Size; local_27c = local_27c + 1
            ) {
          pIVar10 = ImVector<ImGuiSettingsHandler>::operator[]
                              (&local_10->SettingsHandlers,local_27c);
          BulletText("%s",pIVar10->TypeName);
        }
        TreePop();
      }
      uVar4 = ImChunkStream<ImGuiWindowSettings>::size(&local_10->SettingsWindows);
      bVar2 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar4);
      if (bVar2) {
        local_288 = ImChunkStream<ImGuiWindowSettings>::begin(&local_10->SettingsWindows);
        while (local_288 != (ImGuiWindowSettings *)0x0) {
          DebugNodeWindowSettings
                    ((ImGuiWindowSettings *)
                     CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
          local_288 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                ((ImChunkStream<ImGuiWindowSettings> *)in_stack_fffffffffffffae8,
                                 (ImGuiWindowSettings *)
                                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        }
        TreePop();
      }
      uVar4 = ImChunkStream<ImGuiTableSettings>::size(&local_10->SettingsTables);
      bVar2 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",(ulong)uVar4);
      if (bVar2) {
        local_290 = ImChunkStream<ImGuiTableSettings>::begin(&local_10->SettingsTables);
        while (local_290 != (ImGuiTableSettings *)0x0) {
          DebugNodeTableSettings(in_stack_fffffffffffffb20);
          local_290 = ImChunkStream<ImGuiTableSettings>::next_chunk
                                ((ImChunkStream<ImGuiTableSettings> *)in_stack_fffffffffffffae8,
                                 (ImGuiTableSettings *)
                                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
        }
        TreePop();
      }
      uVar4 = ImGuiTextBuffer::size(&local_10->SettingsIniData);
      bVar2 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar4);
      if (bVar2) {
        in_stack_fffffffffffffb50 = ImGuiTextBuffer::c_str(&local_10->SettingsIniData);
        in_stack_fffffffffffffb58 = (long)(local_10->SettingsIniData).Buf.Size;
        fVar14 = GetTextLineHeight();
        ImVec2::ImVec2(&local_298,-1.1754944e-38,fVar14 * 20.0);
        in_stack_fffffffffffffac8 = (ImVec2 *)0x0;
        InputTextMultiline((char *)in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8,
                           (size_t)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                           (ImGuiInputTextFlags)in_stack_fffffffffffffae4,
                           (ImGuiInputTextCallback)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                           in_stack_fffffffffffffb10);
        TreePop();
      }
      TreePop();
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffac8);
    if (bVar2) {
      Text("WINDOWING");
      Indent(in_stack_fffffffffffffae4);
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4b8 = "NULL";
      }
      else {
        local_4b8 = local_10->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_4b8);
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        local_4c0 = "NULL";
      }
      else {
        local_4c0 = local_10->HoveredWindow->RootWindow->Name;
      }
      Text("HoveredWindow->Root: \'%s\'",local_4c0);
      if (local_10->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        local_4c8 = "NULL";
      }
      else {
        local_4c8 = local_10->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",local_4c8);
      if (local_10->MovingWindow == (ImGuiWindow *)0x0) {
        local_4d0 = "NULL";
      }
      else {
        local_4d0 = local_10->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_4d0);
      Unindent(in_stack_fffffffffffffae4);
      Text("ITEMS");
      Indent(in_stack_fffffffffffffae4);
      uVar4 = local_10->ActiveId;
      uVar1 = local_10->ActiveIdPreviousFrame;
      pcVar18 = (char *)(double)local_10->ActiveIdTimer;
      bVar2 = local_10->ActiveIdAllowOverlap;
      pcVar7 = GetInputSourceName((ImGuiInputSource)((ulong)in_stack_fffffffffffffaf0 >> 0x20));
      Text(pcVar18,"ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",(ulong)uVar4,
           (ulong)uVar1,(ulong)(bVar2 & 1),pcVar7);
      if (local_10->ActiveIdWindow == (ImGuiWindow *)0x0) {
        pcVar7 = "NULL";
      }
      else {
        pcVar7 = local_10->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar7);
      local_29c = 0;
      for (local_2a0 = 0x200; source = (ImGuiInputSource)((ulong)in_stack_fffffffffffffaf0 >> 0x20),
          local_2a0 < 0x285; local_2a0 = local_2a0 + 1) {
        bVar2 = ImBitArray<133,_-512>::operator[]
                          ((ImBitArray<133,__512> *)
                           CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                           (int)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        local_29c = bVar2 + local_29c;
      }
      Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
           (ulong)(local_10->ActiveIdUsingMouseWheel & 1),(ulong)local_10->ActiveIdUsingNavDirMask,
           (ulong)local_10->ActiveIdUsingNavInputMask,(ulong)local_29c);
      Text((char *)(double)local_10->HoveredIdTimer,"HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d"
           ,(ulong)local_10->HoveredIdPreviousFrame,(ulong)(local_10->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(local_10->DragDropActive & 1),(ulong)(local_10->DragDropPayload).SourceId,
           (local_10->DragDropPayload).DataType,(ulong)(uint)(local_10->DragDropPayload).DataSize);
      Unindent(in_stack_fffffffffffffae4);
      Text("NAV,FOCUS");
      Indent(in_stack_fffffffffffffae4);
      if (local_10->NavWindow == (ImGuiWindow *)0x0) {
        local_4f8 = "NULL";
      }
      else {
        local_4f8 = local_10->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_4f8);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)local_10->NavId,(ulong)local_10->NavLayer);
      pcVar7 = GetInputSourceName(source);
      Text("NavInputSource: %s",pcVar7);
      Text("NavActive: %d, NavVisible: %d",(ulong)((local_10->IO).NavActive & 1),
           (ulong)((local_10->IO).NavVisible & 1));
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)local_10->NavActivateId,(ulong)local_10->NavActivateDownId,
           (ulong)local_10->NavActivatePressedId,(ulong)local_10->NavActivateInputId);
      Text("NavActivateFlags: %04X",(ulong)(uint)local_10->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(local_10->NavDisableHighlight & 1),(ulong)(local_10->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)local_10->NavFocusScopeId);
      if (local_10->NavWindowingTarget == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffb00 = (ImGuiWindow *)0x1e349d;
      }
      else {
        in_stack_fffffffffffffb00 = (ImGuiWindow *)local_10->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",in_stack_fffffffffffffb00);
      Unindent(in_stack_fffffffffffffae4);
      TreePop();
    }
    if (((local_20->ShowWindowsRects & 1U) != 0) || ((local_20->ShowWindowsBeginOrder & 1U) != 0)) {
      for (local_2a4 = 0; local_2a4 < (local_10->Windows).Size; local_2a4 = local_2a4 + 1) {
        ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_2a4);
        local_2b0 = *ppIVar11;
        if ((local_2b0->WasActive & 1U) != 0) {
          local_2b8 = GetForegroundDrawList((ImGuiWindow *)0x138f6e);
          if ((local_20->ShowWindowsRects & 1U) != 0) {
            local_2c8 = ShowMetricsWindow::Funcs::GetWindowRect
                                  (in_stack_fffffffffffffb00,
                                   (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
            ImDrawList::AddRect((ImDrawList *)
                                CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                (ImVec2 *)in_stack_fffffffffffffb68,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                (ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                (float)in_stack_fffffffffffffb58,
                                (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                SUB84(in_stack_fffffffffffffb50,0));
          }
          if (((local_20->ShowWindowsBeginOrder & 1U) != 0) &&
             ((local_2b0->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_2e8,0x20,"%d",(ulong)(uint)(int)local_2b0->BeginOrderWithinContext)
            ;
            local_2ec = GetFontSize();
            in_stack_fffffffffffffaf8 = &local_2b0->Pos;
            this = &local_2fc;
            this_00 = local_2b8;
            ImVec2::ImVec2(this,local_2ec,local_2ec);
            local_2f4 = operator+(in_stack_fffffffffffffac8,(ImVec2 *)0x139090);
            ImDrawList::AddRectFilled
                      (this_00,this,
                       (ImVec2 *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                       in_stack_fffffffffffffadc,in_stack_fffffffffffffad8,
                       (ImDrawFlags)in_stack_fffffffffffffad4);
            ImDrawList::AddText(this_00,this,(ImU32)in_stack_fffffffffffffae4,
                                (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0
                                                ));
          }
        }
      }
    }
    if ((local_20->ShowTablesRects & 1U) != 0) {
      local_300 = 0;
      while (iVar3 = local_300, iVar5 = ImPool<ImGuiTable>::GetMapSize(&local_10->Tables),
            iVar3 < iVar5) {
        pIVar12 = ImPool<ImGuiTable>::TryGetMapData
                            ((ImPool<ImGuiTable> *)
                             CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                             (ImPoolIdx)in_stack_fffffffffffffad4);
        if ((pIVar12 != (ImGuiTable *)0x0) &&
           (local_10->FrameCount + -1 <= pIVar12->LastFrameActive)) {
          GetForegroundDrawList((ImGuiWindow *)0x1391b1);
          if (local_20->ShowTablesRectsType < 6) {
            ShowMetricsWindow::Funcs::GetTableRect
                      ((ImGuiTable *)in_stack_fffffffffffffb00,
                       (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
                       (int)in_stack_fffffffffffffaf8);
            ImDrawList::AddRect((ImDrawList *)
                                CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                (ImVec2 *)in_stack_fffffffffffffb68,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                (ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                (float)in_stack_fffffffffffffb58,
                                (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                SUB84(in_stack_fffffffffffffb50,0));
          }
          else {
            for (local_314 = 0; local_314 < pIVar12->ColumnsCount; local_314 = local_314 + 1) {
              ShowMetricsWindow::Funcs::GetTableRect
                        ((ImGuiTable *)in_stack_fffffffffffffb00,
                         (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
                         (int)in_stack_fffffffffffffaf8);
              in_stack_fffffffffffffadc = 0x3f800000;
              ImDrawList::AddRect((ImDrawList *)
                                  CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                                  (ImVec2 *)in_stack_fffffffffffffb68,
                                  (ImVec2 *)
                                  CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                  (ImU32)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                  (float)in_stack_fffffffffffffb58,
                                  (ImDrawFlags)((ulong)in_stack_fffffffffffffb50 >> 0x20),
                                  SUB84(in_stack_fffffffffffffb50,0));
            }
          }
        }
        local_300 = local_300 + 1;
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // Stack Tool is your best friend!
        Checkbox("Show stack tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}